

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_scan_header(j_compress_ptr cinfo)

{
  jpeg_marker_writer *pjVar1;
  jpeg_component_info *pjVar2;
  jpeg_component_info *compptr;
  int i;
  my_marker_ptr_conflict marker;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->marker;
  if (cinfo->arith_code == 0) {
    for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->comps_in_scan; compptr._4_4_ = compptr._4_4_ + 1)
    {
      pjVar2 = cinfo->cur_comp_info[compptr._4_4_];
      if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
        emit_dht(cinfo,pjVar2->dc_tbl_no,0);
      }
      if (cinfo->Se != 0) {
        emit_dht(cinfo,pjVar2->ac_tbl_no,1);
      }
    }
  }
  else {
    emit_dac(cinfo);
  }
  if (cinfo->restart_interval != *(uint *)&pjVar1[1].write_file_header) {
    emit_dri(cinfo);
    *(uint *)&pjVar1[1].write_file_header = cinfo->restart_interval;
  }
  emit_sos(cinfo);
  return;
}

Assistant:

METHODDEF(void)
write_scan_header (j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;
  int i;
  jpeg_component_info *compptr;

  if (cinfo->arith_code) {
    /* Emit arith conditioning info.  We may have some duplication
     * if the file has multiple scans, but it's so small it's hardly
     * worth worrying about.
     */
    emit_dac(cinfo);
  } else {
    /* Emit Huffman tables.
     * Note that emit_dht() suppresses any duplicate tables.
     */
    for (i = 0; i < cinfo->comps_in_scan; i++) {
      compptr = cinfo->cur_comp_info[i];
      /* DC needs no table for refinement scan */
      if (cinfo->Ss == 0 && cinfo->Ah == 0)
	emit_dht(cinfo, compptr->dc_tbl_no, FALSE);
      /* AC needs no table when not present */
      if (cinfo->Se)
	emit_dht(cinfo, compptr->ac_tbl_no, TRUE);
    }
  }

  /* Emit DRI if required --- note that DRI value could change for each scan.
   * We avoid wasting space with unnecessary DRIs, however.
   */
  if (cinfo->restart_interval != marker->last_restart_interval) {
    emit_dri(cinfo);
    marker->last_restart_interval = cinfo->restart_interval;
  }

  emit_sos(cinfo);
}